

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

int32 hash_table_lookup(hash_table_t *h,char *key,void **val)

{
  uint32 hash_00;
  size_t len_00;
  hash_entry_t *phVar1;
  size_t len;
  uint32 hash;
  hash_entry_t *entry;
  void **val_local;
  char *key_local;
  hash_table_t *h_local;
  
  hash_00 = key2hash(h,key);
  len_00 = strlen(key);
  phVar1 = lookup(h,hash_00,key,len_00);
  if (phVar1 == (hash_entry_t *)0x0) {
    h_local._4_4_ = -1;
  }
  else {
    if (val != (void **)0x0) {
      *val = phVar1->val;
    }
    h_local._4_4_ = 0;
  }
  return h_local._4_4_;
}

Assistant:

int32
hash_table_lookup(hash_table_t * h, const char *key, void ** val)
{
    hash_entry_t *entry;
    uint32 hash;
    size_t len;

    hash = key2hash(h, key);
    len = strlen(key);

    entry = lookup(h, hash, key, len);
    if (entry) {
        if (val)
            *val = entry->val;
        return 0;
    }
    else
        return -1;
}